

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O2

void png_init_read_transformations(png_structrp png_ptr)

{
  png_uint_16 *ppVar1;
  byte *pbVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  byte bVar7;
  png_byte pVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  png_colorp ppVar13;
  png_bytep ppVar14;
  png_bytep ppVar15;
  undefined1 auVar16 [14];
  undefined1 auVar17 [14];
  bool bVar18;
  undefined1 auVar19 [14];
  undefined1 uVar20;
  png_uint_16 pVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  png_uint_16 pVar26;
  int i_1;
  int iVar27;
  uint uVar28;
  int iVar29;
  png_fixed_point pVar30;
  png_fixed_point pVar31;
  png_uint_16 pVar32;
  uint uVar33;
  png_byte *ppVar34;
  int i;
  ulong uVar35;
  long lVar36;
  long lVar37;
  ushort uVar38;
  png_fixed_point a;
  ulong uVar39;
  png_bytep ppVar40;
  undefined8 uVar41;
  undefined1 auVar42 [16];
  uint local_38;
  png_fixed_point gtest;
  
  pVar31 = png_ptr->screen_gamma;
  iVar27 = (png_ptr->colorspace).gamma;
  if (iVar27 == 0) {
    if (pVar31 == 0) {
      pVar31 = 100000;
      (png_ptr->colorspace).gamma = 100000;
      goto LAB_0019b114;
    }
    pVar31 = png_reciprocal(pVar31);
    (png_ptr->colorspace).gamma = pVar31;
LAB_0019b11a:
    ppVar1 = &(png_ptr->colorspace).flags;
    *(byte *)ppVar1 = (byte)*ppVar1 | 1;
LAB_0019b121:
    uVar28 = png_ptr->transformations & 0xffffdfff;
  }
  else {
    if (pVar31 == 0) {
      pVar31 = png_reciprocal(iVar27);
LAB_0019b114:
      png_ptr->screen_gamma = pVar31;
      goto LAB_0019b11a;
    }
    iVar27 = png_muldiv(&gtest,iVar27,pVar31,100000);
    if (iVar27 != 0) {
      iVar27 = png_gamma_significant(gtest);
      ppVar1 = &(png_ptr->colorspace).flags;
      *(byte *)ppVar1 = (byte)*ppVar1 | 1;
      if (iVar27 != 0) goto LAB_0019b0fc;
      goto LAB_0019b121;
    }
    ppVar1 = &(png_ptr->colorspace).flags;
    *(byte *)ppVar1 = (byte)*ppVar1 | 1;
LAB_0019b0fc:
    uVar28 = png_ptr->transformations | 0x2000;
  }
  png_ptr->transformations = uVar28;
  if ((uVar28 & 0x40080) == 0x40000) {
    png_ptr->transformations = uVar28 & 0xfd7ffe7f;
    pbVar2 = (byte *)((long)&png_ptr->flags + 1);
    *pbVar2 = *pbVar2 & 0xdf;
    png_ptr->num_trans = 0;
  }
  iVar27 = png_gamma_significant(png_ptr->screen_gamma);
  uVar28 = png_ptr->transformations;
  if (iVar27 == 0) {
    uVar28 = uVar28 & 0xff7fffff;
    png_ptr->transformations = uVar28;
    pbVar2 = (byte *)((long)&png_ptr->flags + 1);
    *pbVar2 = *pbVar2 & 0xdf;
  }
  if ((uVar28 & 0x600000) != 0) {
    png_colorspace_set_rgb_coefficients(png_ptr);
    uVar28 = png_ptr->transformations;
  }
  if ((uVar28 >> 8 & 1) == 0) {
    if ((((~uVar28 & 0x4080) == 0) &&
        (pVar26 = (png_ptr->background).red, pVar26 == (png_ptr->background).green)) &&
       (pVar26 == (png_ptr->background).blue)) {
      pbVar2 = (byte *)((long)&png_ptr->mode + 1);
      *pbVar2 = *pbVar2 | 8;
      (png_ptr->background).gray = pVar26;
    }
  }
  else if ((png_ptr->color_type & 2) == 0) {
    pbVar2 = (byte *)((long)&png_ptr->mode + 1);
    *pbVar2 = *pbVar2 | 8;
  }
  bVar22 = png_ptr->color_type;
  uVar33 = uVar28;
  if (bVar22 == 3) {
    uVar39 = (ulong)png_ptr->num_trans;
    if (uVar39 == 0) {
      bVar18 = true;
    }
    else {
      bVar18 = false;
      for (uVar35 = 0; uVar39 != uVar35; uVar35 = uVar35 + 1) {
        if (png_ptr->trans_alpha[uVar35] != 0xff) {
          if (png_ptr->trans_alpha[uVar35] != '\0') goto LAB_0019b2f7;
          bVar18 = true;
        }
      }
      bVar18 = !bVar18;
    }
    png_ptr->transformations = uVar28 & 0xff7fffff;
    pbVar2 = (byte *)((long)&png_ptr->flags + 1);
    *pbVar2 = *pbVar2 & 0xdf;
    uVar33 = uVar28 & 0xff7fffff;
    if (bVar18) {
      uVar33 = uVar28 & 0xff7ffe7f;
      png_ptr->transformations = uVar33;
    }
LAB_0019b2f7:
    if ((~uVar33 & 0x1100) == 0) {
      ppVar13 = png_ptr->palette;
      bVar22 = (png_ptr->background).index;
      (png_ptr->background).red = (ushort)ppVar13[bVar22].red;
      (png_ptr->background).green = (ushort)ppVar13[bVar22].green;
      (png_ptr->background).blue = (ushort)ppVar13[bVar22].blue;
      if ((uVar33 & 0x2080000) == 0x80000) {
        for (uVar35 = 0; uVar39 != uVar35; uVar35 = uVar35 + 1) {
          png_ptr->trans_alpha[uVar35] = ~png_ptr->trans_alpha[uVar35];
        }
        uVar33 = png_ptr->transformations;
      }
    }
  }
  else {
    if ((bVar22 & 4) == 0) {
      pbVar2 = (byte *)((long)&png_ptr->flags + 1);
      *pbVar2 = *pbVar2 & 0xdf;
      png_ptr->transformations = uVar28 & 0xff7fffff;
      uVar33 = uVar28 & 0xff7fffff;
      if (png_ptr->num_trans == 0) {
        uVar33 = uVar28 & 0xff7ffe7f;
        png_ptr->transformations = uVar33;
      }
    }
    if (((bVar22 & 2) == 0) && ((uVar33 & 0x1100) == 0x1100)) {
      pVar26 = (png_ptr->background).gray;
      pVar32 = (png_ptr->trans_color).gray;
      pVar8 = png_ptr->bit_depth;
      if (pVar8 == '\x04') {
        pVar26 = pVar26 * 0x11;
        pVar32 = pVar32 * 0x11;
      }
      else if (pVar8 == '\x02') {
        pVar26 = pVar26 * 0x55;
        pVar32 = pVar32 * 0x55;
      }
      else if (pVar8 == '\x01') {
        pVar26 = pVar26 * 0xff;
        pVar32 = pVar32 * 0xff;
      }
      (png_ptr->background).blue = pVar26;
      (png_ptr->background).green = pVar26;
      (png_ptr->background).red = pVar26;
      if ((uVar33 >> 0x19 & 1) == 0) {
        (png_ptr->trans_color).blue = pVar32;
        (png_ptr->trans_color).green = pVar32;
        (png_ptr->trans_color).red = pVar32;
      }
    }
  }
  if (((uVar33 & 0x380) == 0x280) && (png_ptr->bit_depth != '\x10')) {
    uVar39._0_2_ = (png_ptr->background).red;
    uVar39._2_2_ = (png_ptr->background).green;
    uVar39._4_2_ = (png_ptr->background).blue;
    uVar39._6_2_ = (png_ptr->background).gray;
    auVar16._8_4_ = 0;
    auVar16._0_8_ = uVar39;
    auVar16._12_2_ = uVar39._6_2_;
    auVar17._8_2_ = uVar39._4_2_;
    auVar17._0_8_ = uVar39;
    auVar17._10_4_ = auVar16._10_4_;
    auVar19._6_8_ = 0;
    auVar19._0_6_ = auVar17._8_6_;
    auVar42._0_4_ = (int)((uint)(ushort)(undefined2)uVar39 * 0xff + 0x807f) >> 0x10;
    auVar42._4_4_ = (int)CONCAT82(SUB148(auVar19 << 0x40,6),uVar39._2_2_) * 0xff + 0x807f >> 0x10;
    auVar42._8_4_ = auVar17._8_4_ * 0xff + 0x807f >> 0x10;
    auVar42._12_4_ = (int)((auVar16._10_4_ >> 0x10) * 0xff + 0x807f) >> 0x10;
    auVar42 = packssdw(auVar42,auVar42);
    uVar41 = auVar42._0_8_;
    (png_ptr->background).red = (short)uVar41;
    (png_ptr->background).green = (short)((ulong)uVar41 >> 0x10);
    (png_ptr->background).blue = (short)((ulong)uVar41 >> 0x20);
    (png_ptr->background).gray = (short)((ulong)uVar41 >> 0x30);
  }
  if (((uVar33 & 0x180) == 0x80 && (uVar33 & 0x4000400) != 0) && (png_ptr->bit_depth == '\x10')) {
    uVar3 = (png_ptr->background).red;
    uVar4 = (png_ptr->background).green;
    uVar5 = (png_ptr->background).blue;
    uVar6 = (png_ptr->background).gray;
    (png_ptr->background).red = uVar3 * 0x101;
    (png_ptr->background).green = uVar4 * 0x101;
    (png_ptr->background).blue = uVar5 * 0x101;
    (png_ptr->background).gray = uVar6 * 0x101;
  }
  (png_ptr->background_1).gray = (png_ptr->background).gray;
  uVar20 = (png_ptr->background).field_0x1;
  pVar26 = (png_ptr->background).red;
  pVar32 = (png_ptr->background).green;
  pVar21 = (png_ptr->background).blue;
  (png_ptr->background_1).index = (png_ptr->background).index;
  (png_ptr->background_1).field_0x1 = uVar20;
  (png_ptr->background_1).red = pVar26;
  (png_ptr->background_1).green = pVar32;
  (png_ptr->background_1).blue = pVar21;
  if ((uVar33 >> 0xd & 1) == 0) {
    if ((uVar33 & 0x600000) != 0) {
      iVar27 = png_gamma_significant((png_ptr->colorspace).gamma);
      if ((iVar27 != 0) || (iVar27 = png_gamma_significant(png_ptr->screen_gamma), iVar27 != 0))
      goto LAB_0019b609;
      uVar33 = png_ptr->transformations;
    }
    if (((char)uVar33 < '\0') &&
       (((iVar27 = png_gamma_significant((png_ptr->colorspace).gamma), iVar27 != 0 ||
         (iVar27 = png_gamma_significant(png_ptr->screen_gamma), iVar27 != 0)) ||
        ((png_ptr->background_gamma_type == '\x03' &&
         (iVar27 = png_gamma_significant(png_ptr->background_gamma), iVar27 != 0))))))
    goto LAB_0019b609;
    uVar28 = png_ptr->transformations;
    if ((uVar28 >> 0x17 & 1) != 0) {
      iVar27 = png_gamma_significant(png_ptr->screen_gamma);
      if (iVar27 != 0) goto LAB_0019b609;
      uVar28 = png_ptr->transformations;
    }
    if ((-1 < (char)uVar28) || (png_ptr->color_type != '\x03')) goto LAB_0019bb57;
    uVar9 = png_ptr->num_trans;
    uVar10 = (png_ptr->background).red;
    uVar11 = (png_ptr->background).green;
    uVar12 = (png_ptr->background).blue;
    ppVar34 = &png_ptr->palette->blue;
    for (uVar39 = 0; uVar9 != uVar39; uVar39 = uVar39 + 1) {
      ppVar14 = png_ptr->trans_alpha;
      bVar22 = ppVar14[uVar39];
      if (bVar22 != 0xff) {
        if (bVar22 == 0) {
          ((png_color *)(ppVar34 + -2))->red = (byte)uVar10;
          ppVar34[-1] = (byte)uVar11;
          *ppVar34 = (byte)uVar12;
        }
        else {
          uVar38 = (ushort)((png_color *)(ppVar34 + -2))->red * (ushort)bVar22 + 0x80 +
                   (ushort)(byte)~bVar22 * (uVar10 & 0xff);
          ((png_color *)(ppVar34 + -2))->red = (byte)((uint)(uVar38 >> 8) + (uint)uVar38 >> 8);
          uVar38 = (ushort)ppVar34[-1] * (ushort)ppVar14[uVar39] + 0x80 +
                   (ppVar14[uVar39] ^ 0xff) * (uVar11 & 0xff);
          ppVar34[-1] = (byte)((uint)(uVar38 >> 8) + (uint)uVar38 >> 8);
          uVar28 = (uint)*ppVar34 * (uint)ppVar14[uVar39] + 0x80 +
                   (ppVar14[uVar39] ^ 0xff) * (uint)(uVar12 & 0xff) & 0xffff;
          *ppVar34 = (byte)((uVar28 >> 8) + uVar28 >> 8);
        }
      }
      ppVar34 = ppVar34 + 3;
    }
    uVar28 = 0xffffff7f;
LAB_0019bb4b:
    uVar28 = uVar28 & png_ptr->transformations;
  }
  else {
LAB_0019b609:
    png_build_gamma_table(png_ptr,(uint)png_ptr->bit_depth);
    uVar28 = png_ptr->transformations;
    if ((char)uVar28 < '\0') {
      if ((uVar28 & 0x600000) != 0) {
        png_warning(png_ptr,"libpng does not support gamma+background+rgb_to_gray");
      }
      if (png_ptr->color_type != '\x03') {
        pVar8 = png_ptr->background_gamma_type;
        if (pVar8 == '\x03') {
          pVar31 = png_reciprocal(png_ptr->background_gamma);
          a = png_ptr->background_gamma;
          pVar30 = png_ptr->screen_gamma;
LAB_0019b7ac:
          pVar30 = png_reciprocal2(a,pVar30);
        }
        else {
          if (pVar8 == '\x02') {
            pVar31 = png_reciprocal((png_ptr->colorspace).gamma);
            pVar30 = png_ptr->screen_gamma;
            a = (png_ptr->colorspace).gamma;
            goto LAB_0019b7ac;
          }
          if (pVar8 != '\x01') {
            png_error(png_ptr,"invalid background gamma type");
          }
          pVar31 = png_ptr->screen_gamma;
          pVar30 = 100000;
        }
        iVar27 = png_gamma_significant(pVar31);
        iVar29 = png_gamma_significant(pVar30);
        if (iVar27 != 0) {
          pVar26 = png_gamma_correct(png_ptr,(uint)(png_ptr->background).gray,pVar31);
          (png_ptr->background_1).gray = pVar26;
        }
        if (iVar29 != 0) {
          pVar26 = png_gamma_correct(png_ptr,(uint)(png_ptr->background).gray,pVar30);
          (png_ptr->background).gray = pVar26;
        }
        uVar9 = (png_ptr->background).red;
        if (((uVar9 == (png_ptr->background).green) && (uVar9 == (png_ptr->background).blue)) &&
           (uVar9 == (png_ptr->background).gray)) {
          pVar26 = (png_ptr->background_1).gray;
          (png_ptr->background_1).blue = pVar26;
          (png_ptr->background_1).green = pVar26;
          (png_ptr->background_1).red = pVar26;
          (png_ptr->background).blue = uVar9;
          (png_ptr->background).green = uVar9;
          (png_ptr->background).red = uVar9;
        }
        else {
          if (iVar27 != 0) {
            pVar26 = png_gamma_correct(png_ptr,(uint)uVar9,pVar31);
            (png_ptr->background_1).red = pVar26;
            pVar26 = png_gamma_correct(png_ptr,(uint)(png_ptr->background).green,pVar31);
            (png_ptr->background_1).green = pVar26;
            pVar26 = png_gamma_correct(png_ptr,(uint)(png_ptr->background).blue,pVar31);
            (png_ptr->background_1).blue = pVar26;
          }
          if (iVar29 != 0) {
            pVar26 = png_gamma_correct(png_ptr,(uint)(png_ptr->background).red,pVar30);
            (png_ptr->background).red = pVar26;
            pVar26 = png_gamma_correct(png_ptr,(uint)(png_ptr->background).green,pVar30);
            (png_ptr->background).green = pVar26;
            pVar26 = png_gamma_correct(png_ptr,(uint)(png_ptr->background).blue,pVar30);
            (png_ptr->background).blue = pVar26;
          }
        }
        png_ptr->background_gamma_type = '\x01';
        uVar28 = png_ptr->transformations;
        goto LAB_0019bb57;
      }
      ppVar13 = png_ptr->palette;
      uVar9 = png_ptr->num_palette;
      pVar8 = png_ptr->background_gamma_type;
      pVar31 = 100000;
      if (pVar8 == '\x01') {
        pVar30 = png_ptr->screen_gamma;
LAB_0019b931:
        iVar27 = png_gamma_significant(pVar31);
        local_38 = (uint)(png_ptr->background).red;
        if (iVar27 == 0) {
          bVar22 = (byte)(png_ptr->background).green;
          bVar23 = (byte)(png_ptr->background).blue;
        }
        else {
          bVar22 = png_gamma_8bit_correct(local_38,pVar31);
          local_38 = (uint)bVar22;
          bVar22 = png_gamma_8bit_correct((uint)(png_ptr->background).green,pVar31);
          bVar23 = png_gamma_8bit_correct((uint)(png_ptr->background).blue,pVar31);
        }
        iVar27 = png_gamma_significant(pVar30);
        uVar28 = (uint)(png_ptr->background).red;
        if (iVar27 == 0) {
          bVar24 = (byte)(png_ptr->background).green;
          bVar25 = (byte)(png_ptr->background).blue;
        }
        else {
          bVar24 = png_gamma_8bit_correct(uVar28,pVar30);
          uVar28 = (uint)bVar24;
          bVar24 = png_gamma_8bit_correct((uint)(png_ptr->background).green,pVar30);
          bVar25 = png_gamma_8bit_correct((uint)(png_ptr->background).blue,pVar30);
        }
      }
      else {
        if (pVar8 == '\x03') {
          pVar30 = png_reciprocal(png_ptr->background_gamma);
          pVar31 = png_reciprocal2(png_ptr->background_gamma,png_ptr->screen_gamma);
          goto LAB_0019b931;
        }
        pVar30 = 100000;
        if (pVar8 != '\x02') goto LAB_0019b931;
        uVar10 = (png_ptr->background).red;
        ppVar14 = png_ptr->gamma_table;
        ppVar40 = png_ptr->gamma_to_1;
        local_38._0_1_ = ppVar14[uVar10];
        uVar11 = (png_ptr->background).green;
        bVar22 = ppVar14[uVar11];
        uVar12 = (png_ptr->background).blue;
        bVar23 = ppVar14[uVar12];
        uVar28 = (uint)ppVar40[uVar10];
        bVar24 = ppVar40[uVar11];
        bVar25 = ppVar40[uVar12];
      }
      ppVar34 = &ppVar13->blue;
      for (uVar39 = 0; uVar9 != uVar39; uVar39 = uVar39 + 1) {
        if (uVar39 < png_ptr->num_trans) {
          ppVar14 = png_ptr->trans_alpha;
          bVar7 = ppVar14[uVar39];
          if (bVar7 == 0xff) goto LAB_0019ba42;
          if (bVar7 != 0) {
            ppVar40 = png_ptr->gamma_from_1;
            ppVar15 = png_ptr->gamma_to_1;
            iVar27 = (uint)(byte)~bVar7 * (uVar28 & 0xff) +
                     (uint)ppVar15[((png_color *)(ppVar34 + -2))->red] * (uint)bVar7;
            ((png_color *)(ppVar34 + -2))->red =
                 ppVar40[iVar27 + (iVar27 + 0x80U >> 8 & 0xff) + 0x80 >> 8 & 0xff];
            iVar27 = (ppVar14[uVar39] ^ 0xff) * (uint)bVar24 +
                     (uint)ppVar15[ppVar34[-1]] * (uint)ppVar14[uVar39];
            ppVar34[-1] = ppVar40[(iVar27 + 0x80U >> 8 & 0xff) + iVar27 + 0x80 >> 8 & 0xff];
            iVar27 = (ppVar14[uVar39] ^ 0xff) * (uint)bVar25 +
                     (uint)ppVar15[*ppVar34] * (uint)ppVar14[uVar39];
            uVar35 = (ulong)(iVar27 + (iVar27 + 0x80U >> 8 & 0xff) + 0x80 >> 8 & 0xff);
            goto LAB_0019ba68;
          }
          ((png_color *)(ppVar34 + -2))->red = (byte)local_38;
          ppVar34[-1] = bVar22;
          *ppVar34 = bVar23;
        }
        else {
LAB_0019ba42:
          ppVar40 = png_ptr->gamma_table;
          ((png_color *)(ppVar34 + -2))->red = ppVar40[((png_color *)(ppVar34 + -2))->red];
          ppVar34[-1] = ppVar40[ppVar34[-1]];
          uVar35 = (ulong)*ppVar34;
LAB_0019ba68:
          *ppVar34 = ppVar40[uVar35];
        }
        ppVar34 = ppVar34 + 3;
      }
      uVar28 = 0xffffdf7f;
      goto LAB_0019bb4b;
    }
    if ((png_ptr->color_type != '\x03') || (((byte)(uVar28 >> 0xc) & (uVar28 & 0x600000) != 0) != 0)
       ) goto LAB_0019bb57;
    ppVar13 = png_ptr->palette;
    uVar9 = png_ptr->num_palette;
    for (lVar36 = 0; (ulong)uVar9 * 3 != lVar36; lVar36 = lVar36 + 3) {
      ppVar14 = png_ptr->gamma_table;
      (&ppVar13->red)[lVar36] = ppVar14[(&ppVar13->red)[lVar36]];
      (&ppVar13->green)[lVar36] = ppVar14[(&ppVar13->green)[lVar36]];
      (&ppVar13->blue)[lVar36] = ppVar14[(&ppVar13->blue)[lVar36]];
    }
    uVar28 = uVar28 & 0xffffdf7f;
  }
  png_ptr->transformations = uVar28;
LAB_0019bb57:
  if (((uVar28 & 0x1008) == 8) && (png_ptr->color_type == '\x03')) {
    pVar8 = (png_ptr->sig_bit).red;
    png_ptr->transformations = uVar28 & 0xffffeff7;
    lVar36 = (ulong)png_ptr->num_palette * 3;
    if ((byte)(pVar8 - 1) < 7) {
      for (lVar37 = 0; lVar36 != lVar37; lVar37 = lVar37 + 3) {
        (&png_ptr->palette->red)[lVar37] = (&png_ptr->palette->red)[lVar37] >> (8 - pVar8 & 0x1f);
      }
    }
    pVar8 = (png_ptr->sig_bit).green;
    if ((byte)(pVar8 - 1) < 7) {
      for (lVar37 = 0; lVar36 != lVar37; lVar37 = lVar37 + 3) {
        (&png_ptr->palette->green)[lVar37] =
             (&png_ptr->palette->green)[lVar37] >> (8 - pVar8 & 0x1f);
      }
    }
    pVar8 = (png_ptr->sig_bit).blue;
    if ((byte)(pVar8 - 1) < 7) {
      for (lVar37 = 0; lVar36 != lVar37; lVar37 = lVar37 + 3) {
        (&png_ptr->palette->blue)[lVar37] = (&png_ptr->palette->blue)[lVar37] >> (8 - pVar8 & 0x1f);
      }
    }
  }
  return;
}

Assistant:

void /* PRIVATE */
png_init_read_transformations(png_structrp png_ptr)
{
   png_debug(1, "in png_init_read_transformations");

   /* This internal function is called from png_read_start_row in pngrutil.c
    * and it is called before the 'rowbytes' calculation is done, so the code
    * in here can change or update the transformations flags.
    *
    * First do updates that do not depend on the details of the PNG image data
    * being processed.
    */

#ifdef PNG_READ_GAMMA_SUPPORTED
   /* Prior to 1.5.4 these tests were performed from png_set_gamma, 1.5.4 adds
    * png_set_alpha_mode and this is another source for a default file gamma so
    * the test needs to be performed later - here.  In addition prior to 1.5.4
    * the tests were repeated for the PALETTE color type here - this is no
    * longer necessary (and doesn't seem to have been necessary before.)
    */
   {
      /* The following temporary indicates if overall gamma correction is
       * required.
       */
      int gamma_correction = 0;

      if (png_ptr->colorspace.gamma != 0) /* has been set */
      {
         if (png_ptr->screen_gamma != 0) /* screen set too */
            gamma_correction = png_gamma_threshold(png_ptr->colorspace.gamma,
                png_ptr->screen_gamma);

         else
            /* Assume the output matches the input; a long time default behavior
             * of libpng, although the standard has nothing to say about this.
             */
            png_ptr->screen_gamma = png_reciprocal(png_ptr->colorspace.gamma);
      }

      else if (png_ptr->screen_gamma != 0)
         /* The converse - assume the file matches the screen, note that this
          * perhaps undesireable default can (from 1.5.4) be changed by calling
          * png_set_alpha_mode (even if the alpha handling mode isn't required
          * or isn't changed from the default.)
          */
         png_ptr->colorspace.gamma = png_reciprocal(png_ptr->screen_gamma);

      else /* neither are set */
         /* Just in case the following prevents any processing - file and screen
          * are both assumed to be linear and there is no way to introduce a
          * third gamma value other than png_set_background with 'UNIQUE', and,
          * prior to 1.5.4
          */
         png_ptr->screen_gamma = png_ptr->colorspace.gamma = PNG_FP_1;

      /* We have a gamma value now. */
      png_ptr->colorspace.flags |= PNG_COLORSPACE_HAVE_GAMMA;

      /* Now turn the gamma transformation on or off as appropriate.  Notice
       * that PNG_GAMMA just refers to the file->screen correction.  Alpha
       * composition may independently cause gamma correction because it needs
       * linear data (e.g. if the file has a gAMA chunk but the screen gamma
       * hasn't been specified.)  In any case this flag may get turned off in
       * the code immediately below if the transform can be handled outside the
       * row loop.
       */
      if (gamma_correction != 0)
         png_ptr->transformations |= PNG_GAMMA;

      else
         png_ptr->transformations &= ~PNG_GAMMA;
   }
#endif

   /* Certain transformations have the effect of preventing other
    * transformations that happen afterward in png_do_read_transformations;
    * resolve the interdependencies here.  From the code of
    * png_do_read_transformations the order is:
    *
    *  1) PNG_EXPAND (including PNG_EXPAND_tRNS)
    *  2) PNG_STRIP_ALPHA (if no compose)
    *  3) PNG_RGB_TO_GRAY
    *  4) PNG_GRAY_TO_RGB iff !PNG_BACKGROUND_IS_GRAY
    *  5) PNG_COMPOSE
    *  6) PNG_GAMMA
    *  7) PNG_STRIP_ALPHA (if compose)
    *  8) PNG_ENCODE_ALPHA
    *  9) PNG_SCALE_16_TO_8
    * 10) PNG_16_TO_8
    * 11) PNG_QUANTIZE (converts to palette)
    * 12) PNG_EXPAND_16
    * 13) PNG_GRAY_TO_RGB iff PNG_BACKGROUND_IS_GRAY
    * 14) PNG_INVERT_MONO
    * 15) PNG_INVERT_ALPHA
    * 16) PNG_SHIFT
    * 17) PNG_PACK
    * 18) PNG_BGR
    * 19) PNG_PACKSWAP
    * 20) PNG_FILLER (includes PNG_ADD_ALPHA)
    * 21) PNG_SWAP_ALPHA
    * 22) PNG_SWAP_BYTES
    * 23) PNG_USER_TRANSFORM [must be last]
    */
#ifdef PNG_READ_STRIP_ALPHA_SUPPORTED
   if ((png_ptr->transformations & PNG_STRIP_ALPHA) != 0 &&
       (png_ptr->transformations & PNG_COMPOSE) == 0)
   {
      /* Stripping the alpha channel happens immediately after the 'expand'
       * transformations, before all other transformation, so it cancels out
       * the alpha handling.  It has the side effect negating the effect of
       * PNG_EXPAND_tRNS too:
       */
      png_ptr->transformations &= ~(PNG_BACKGROUND_EXPAND | PNG_ENCODE_ALPHA |
         PNG_EXPAND_tRNS);
      png_ptr->flags &= ~PNG_FLAG_OPTIMIZE_ALPHA;

      /* Kill the tRNS chunk itself too.  Prior to 1.5.4 this did not happen
       * so transparency information would remain just so long as it wasn't
       * expanded.  This produces unexpected API changes if the set of things
       * that do PNG_EXPAND_tRNS changes (perfectly possible given the
       * documentation - which says ask for what you want, accept what you
       * get.)  This makes the behavior consistent from 1.5.4:
       */
      png_ptr->num_trans = 0;
   }
#endif /* STRIP_ALPHA supported, no COMPOSE */

#ifdef PNG_READ_ALPHA_MODE_SUPPORTED
   /* If the screen gamma is about 1.0 then the OPTIMIZE_ALPHA and ENCODE_ALPHA
    * settings will have no effect.
    */
   if (png_gamma_significant(png_ptr->screen_gamma) == 0)
   {
      png_ptr->transformations &= ~PNG_ENCODE_ALPHA;
      png_ptr->flags &= ~PNG_FLAG_OPTIMIZE_ALPHA;
   }
#endif

#ifdef PNG_READ_RGB_TO_GRAY_SUPPORTED
   /* Make sure the coefficients for the rgb to gray conversion are set
    * appropriately.
    */
   if ((png_ptr->transformations & PNG_RGB_TO_GRAY) != 0)
      png_colorspace_set_rgb_coefficients(png_ptr);
#endif

#ifdef PNG_READ_GRAY_TO_RGB_SUPPORTED
#if defined(PNG_READ_EXPAND_SUPPORTED) && defined(PNG_READ_BACKGROUND_SUPPORTED)
   /* Detect gray background and attempt to enable optimization for
    * gray --> RGB case.
    *
    * Note:  if PNG_BACKGROUND_EXPAND is set and color_type is either RGB or
    * RGB_ALPHA (in which case need_expand is superfluous anyway), the
    * background color might actually be gray yet not be flagged as such.
    * This is not a problem for the current code, which uses
    * PNG_BACKGROUND_IS_GRAY only to decide when to do the
    * png_do_gray_to_rgb() transformation.
    *
    * TODO: this code needs to be revised to avoid the complexity and
    * interdependencies.  The color type of the background should be recorded in
    * png_set_background, along with the bit depth, then the code has a record
    * of exactly what color space the background is currently in.
    */
   if ((png_ptr->transformations & PNG_BACKGROUND_EXPAND) != 0)
   {
      /* PNG_BACKGROUND_EXPAND: the background is in the file color space, so if
       * the file was grayscale the background value is gray.
       */
      if ((png_ptr->color_type & PNG_COLOR_MASK_COLOR) == 0)
         png_ptr->mode |= PNG_BACKGROUND_IS_GRAY;
   }

   else if ((png_ptr->transformations & PNG_COMPOSE) != 0)
   {
      /* PNG_COMPOSE: png_set_background was called with need_expand false,
       * so the color is in the color space of the output or png_set_alpha_mode
       * was called and the color is black.  Ignore RGB_TO_GRAY because that
       * happens before GRAY_TO_RGB.
       */
      if ((png_ptr->transformations & PNG_GRAY_TO_RGB) != 0)
      {
         if (png_ptr->background.red == png_ptr->background.green &&
             png_ptr->background.red == png_ptr->background.blue)
         {
            png_ptr->mode |= PNG_BACKGROUND_IS_GRAY;
            png_ptr->background.gray = png_ptr->background.red;
         }
      }
   }
#endif /* READ_EXPAND && READ_BACKGROUND */
#endif /* READ_GRAY_TO_RGB */

   /* For indexed PNG data (PNG_COLOR_TYPE_PALETTE) many of the transformations
    * can be performed directly on the palette, and some (such as rgb to gray)
    * can be optimized inside the palette.  This is particularly true of the
    * composite (background and alpha) stuff, which can be pretty much all done
    * in the palette even if the result is expanded to RGB or gray afterward.
    *
    * NOTE: this is Not Yet Implemented, the code behaves as in 1.5.1 and
    * earlier and the palette stuff is actually handled on the first row.  This
    * leads to the reported bug that the palette returned by png_get_PLTE is not
    * updated.
    */
   if (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE)
      png_init_palette_transformations(png_ptr);

   else
      png_init_rgb_transformations(png_ptr);

#if defined(PNG_READ_BACKGROUND_SUPPORTED) && \
   defined(PNG_READ_EXPAND_16_SUPPORTED)
   if ((png_ptr->transformations & PNG_EXPAND_16) != 0 &&
       (png_ptr->transformations & PNG_COMPOSE) != 0 &&
       (png_ptr->transformations & PNG_BACKGROUND_EXPAND) == 0 &&
       png_ptr->bit_depth != 16)
   {
      /* TODO: fix this.  Because the expand_16 operation is after the compose
       * handling the background color must be 8, not 16, bits deep, but the
       * application will supply a 16-bit value so reduce it here.
       *
       * The PNG_BACKGROUND_EXPAND code above does not expand to 16 bits at
       * present, so that case is ok (until do_expand_16 is moved.)
       *
       * NOTE: this discards the low 16 bits of the user supplied background
       * color, but until expand_16 works properly there is no choice!
       */
#     define CHOP(x) (x)=((png_uint_16)PNG_DIV257(x))
      CHOP(png_ptr->background.red);
      CHOP(png_ptr->background.green);
      CHOP(png_ptr->background.blue);
      CHOP(png_ptr->background.gray);
#     undef CHOP
   }
#endif /* READ_BACKGROUND && READ_EXPAND_16 */

#if defined(PNG_READ_BACKGROUND_SUPPORTED) && \
   (defined(PNG_READ_SCALE_16_TO_8_SUPPORTED) || \
   defined(PNG_READ_STRIP_16_TO_8_SUPPORTED))
   if ((png_ptr->transformations & (PNG_16_TO_8|PNG_SCALE_16_TO_8)) != 0 &&
       (png_ptr->transformations & PNG_COMPOSE) != 0 &&
       (png_ptr->transformations & PNG_BACKGROUND_EXPAND) == 0 &&
       png_ptr->bit_depth == 16)
   {
      /* On the other hand, if a 16-bit file is to be reduced to 8-bits per
       * component this will also happen after PNG_COMPOSE and so the background
       * color must be pre-expanded here.
       *
       * TODO: fix this too.
       */
      png_ptr->background.red = (png_uint_16)(png_ptr->background.red * 257);
      png_ptr->background.green =
         (png_uint_16)(png_ptr->background.green * 257);
      png_ptr->background.blue = (png_uint_16)(png_ptr->background.blue * 257);
      png_ptr->background.gray = (png_uint_16)(png_ptr->background.gray * 257);
   }
#endif

   /* NOTE: below 'PNG_READ_ALPHA_MODE_SUPPORTED' is presumed to also enable the
    * background support (see the comments in scripts/pnglibconf.dfa), this
    * allows pre-multiplication of the alpha channel to be implemented as
    * compositing on black.  This is probably sub-optimal and has been done in
    * 1.5.4 betas simply to enable external critique and testing (i.e. to
    * implement the new API quickly, without lots of internal changes.)
    */

#ifdef PNG_READ_GAMMA_SUPPORTED
#  ifdef PNG_READ_BACKGROUND_SUPPORTED
      /* Includes ALPHA_MODE */
      png_ptr->background_1 = png_ptr->background;
#  endif

   /* This needs to change - in the palette image case a whole set of tables are
    * built when it would be quicker to just calculate the correct value for
    * each palette entry directly.  Also, the test is too tricky - why check
    * PNG_RGB_TO_GRAY if PNG_GAMMA is not set?  The answer seems to be that
    * PNG_GAMMA is cancelled even if the gamma is known?  The test excludes the
    * PNG_COMPOSE case, so apparently if there is no *overall* gamma correction
    * the gamma tables will not be built even if composition is required on a
    * gamma encoded value.
    *
    * In 1.5.4 this is addressed below by an additional check on the individual
    * file gamma - if it is not 1.0 both RGB_TO_GRAY and COMPOSE need the
    * tables.
    */
   if ((png_ptr->transformations & PNG_GAMMA) != 0 ||
       ((png_ptr->transformations & PNG_RGB_TO_GRAY) != 0 &&
        (png_gamma_significant(png_ptr->colorspace.gamma) != 0 ||
         png_gamma_significant(png_ptr->screen_gamma) != 0)) ||
        ((png_ptr->transformations & PNG_COMPOSE) != 0 &&
         (png_gamma_significant(png_ptr->colorspace.gamma) != 0 ||
          png_gamma_significant(png_ptr->screen_gamma) != 0
#  ifdef PNG_READ_BACKGROUND_SUPPORTED
         || (png_ptr->background_gamma_type == PNG_BACKGROUND_GAMMA_UNIQUE &&
           png_gamma_significant(png_ptr->background_gamma) != 0)
#  endif
        )) || ((png_ptr->transformations & PNG_ENCODE_ALPHA) != 0 &&
       png_gamma_significant(png_ptr->screen_gamma) != 0))
   {
      png_build_gamma_table(png_ptr, png_ptr->bit_depth);

#ifdef PNG_READ_BACKGROUND_SUPPORTED
      if ((png_ptr->transformations & PNG_COMPOSE) != 0)
      {
         /* Issue a warning about this combination: because RGB_TO_GRAY is
          * optimized to do the gamma transform if present yet do_background has
          * to do the same thing if both options are set a
          * double-gamma-correction happens.  This is true in all versions of
          * libpng to date.
          */
         if ((png_ptr->transformations & PNG_RGB_TO_GRAY) != 0)
            png_warning(png_ptr,
                "libpng does not support gamma+background+rgb_to_gray");

         if ((png_ptr->color_type == PNG_COLOR_TYPE_PALETTE) != 0)
         {
            /* We don't get to here unless there is a tRNS chunk with non-opaque
             * entries - see the checking code at the start of this function.
             */
            png_color back, back_1;
            png_colorp palette = png_ptr->palette;
            int num_palette = png_ptr->num_palette;
            int i;
            if (png_ptr->background_gamma_type == PNG_BACKGROUND_GAMMA_FILE)
            {

               back.red = png_ptr->gamma_table[png_ptr->background.red];
               back.green = png_ptr->gamma_table[png_ptr->background.green];
               back.blue = png_ptr->gamma_table[png_ptr->background.blue];

               back_1.red = png_ptr->gamma_to_1[png_ptr->background.red];
               back_1.green = png_ptr->gamma_to_1[png_ptr->background.green];
               back_1.blue = png_ptr->gamma_to_1[png_ptr->background.blue];
            }
            else
            {
               png_fixed_point g, gs;

               switch (png_ptr->background_gamma_type)
               {
                  case PNG_BACKGROUND_GAMMA_SCREEN:
                     g = (png_ptr->screen_gamma);
                     gs = PNG_FP_1;
                     break;

                  case PNG_BACKGROUND_GAMMA_FILE:
                     g = png_reciprocal(png_ptr->colorspace.gamma);
                     gs = png_reciprocal2(png_ptr->colorspace.gamma,
                         png_ptr->screen_gamma);
                     break;

                  case PNG_BACKGROUND_GAMMA_UNIQUE:
                     g = png_reciprocal(png_ptr->background_gamma);
                     gs = png_reciprocal2(png_ptr->background_gamma,
                         png_ptr->screen_gamma);
                     break;
                  default:
                     g = PNG_FP_1;    /* back_1 */
                     gs = PNG_FP_1;   /* back */
                     break;
               }

               if (png_gamma_significant(gs) != 0)
               {
                  back.red = png_gamma_8bit_correct(png_ptr->background.red,
                      gs);
                  back.green = png_gamma_8bit_correct(png_ptr->background.green,
                      gs);
                  back.blue = png_gamma_8bit_correct(png_ptr->background.blue,
                      gs);
               }

               else
               {
                  back.red   = (png_byte)png_ptr->background.red;
                  back.green = (png_byte)png_ptr->background.green;
                  back.blue  = (png_byte)png_ptr->background.blue;
               }

               if (png_gamma_significant(g) != 0)
               {
                  back_1.red = png_gamma_8bit_correct(png_ptr->background.red,
                      g);
                  back_1.green = png_gamma_8bit_correct(
                      png_ptr->background.green, g);
                  back_1.blue = png_gamma_8bit_correct(png_ptr->background.blue,
                      g);
               }

               else
               {
                  back_1.red   = (png_byte)png_ptr->background.red;
                  back_1.green = (png_byte)png_ptr->background.green;
                  back_1.blue  = (png_byte)png_ptr->background.blue;
               }
            }

            for (i = 0; i < num_palette; i++)
            {
               if (i < (int)png_ptr->num_trans &&
                   png_ptr->trans_alpha[i] != 0xff)
               {
                  if (png_ptr->trans_alpha[i] == 0)
                  {
                     palette[i] = back;
                  }
                  else /* if (png_ptr->trans_alpha[i] != 0xff) */
                  {
                     png_byte v, w;

                     v = png_ptr->gamma_to_1[palette[i].red];
                     png_composite(w, v, png_ptr->trans_alpha[i], back_1.red);
                     palette[i].red = png_ptr->gamma_from_1[w];

                     v = png_ptr->gamma_to_1[palette[i].green];
                     png_composite(w, v, png_ptr->trans_alpha[i], back_1.green);
                     palette[i].green = png_ptr->gamma_from_1[w];

                     v = png_ptr->gamma_to_1[palette[i].blue];
                     png_composite(w, v, png_ptr->trans_alpha[i], back_1.blue);
                     palette[i].blue = png_ptr->gamma_from_1[w];
                  }
               }
               else
               {
                  palette[i].red = png_ptr->gamma_table[palette[i].red];
                  palette[i].green = png_ptr->gamma_table[palette[i].green];
                  palette[i].blue = png_ptr->gamma_table[palette[i].blue];
               }
            }

            /* Prevent the transformations being done again.
             *
             * NOTE: this is highly dubious; it removes the transformations in
             * place.  This seems inconsistent with the general treatment of the
             * transformations elsewhere.
             */
            png_ptr->transformations &= ~(PNG_COMPOSE | PNG_GAMMA);
         } /* color_type == PNG_COLOR_TYPE_PALETTE */

         /* if (png_ptr->background_gamma_type!=PNG_BACKGROUND_GAMMA_UNKNOWN) */
         else /* color_type != PNG_COLOR_TYPE_PALETTE */
         {
            int gs_sig, g_sig;
            png_fixed_point g = PNG_FP_1;  /* Correction to linear */
            png_fixed_point gs = PNG_FP_1; /* Correction to screen */

            switch (png_ptr->background_gamma_type)
            {
               case PNG_BACKGROUND_GAMMA_SCREEN:
                  g = png_ptr->screen_gamma;
                  /* gs = PNG_FP_1; */
                  break;

               case PNG_BACKGROUND_GAMMA_FILE:
                  g = png_reciprocal(png_ptr->colorspace.gamma);
                  gs = png_reciprocal2(png_ptr->colorspace.gamma,
                      png_ptr->screen_gamma);
                  break;

               case PNG_BACKGROUND_GAMMA_UNIQUE:
                  g = png_reciprocal(png_ptr->background_gamma);
                  gs = png_reciprocal2(png_ptr->background_gamma,
                      png_ptr->screen_gamma);
                  break;

               default:
                  png_error(png_ptr, "invalid background gamma type");
            }

            g_sig = png_gamma_significant(g);
            gs_sig = png_gamma_significant(gs);

            if (g_sig != 0)
               png_ptr->background_1.gray = png_gamma_correct(png_ptr,
                   png_ptr->background.gray, g);

            if (gs_sig != 0)
               png_ptr->background.gray = png_gamma_correct(png_ptr,
                   png_ptr->background.gray, gs);

            if ((png_ptr->background.red != png_ptr->background.green) ||
                (png_ptr->background.red != png_ptr->background.blue) ||
                (png_ptr->background.red != png_ptr->background.gray))
            {
               /* RGB or RGBA with color background */
               if (g_sig != 0)
               {
                  png_ptr->background_1.red = png_gamma_correct(png_ptr,
                      png_ptr->background.red, g);

                  png_ptr->background_1.green = png_gamma_correct(png_ptr,
                      png_ptr->background.green, g);

                  png_ptr->background_1.blue = png_gamma_correct(png_ptr,
                      png_ptr->background.blue, g);
               }

               if (gs_sig != 0)
               {
                  png_ptr->background.red = png_gamma_correct(png_ptr,
                      png_ptr->background.red, gs);

                  png_ptr->background.green = png_gamma_correct(png_ptr,
                      png_ptr->background.green, gs);

                  png_ptr->background.blue = png_gamma_correct(png_ptr,
                      png_ptr->background.blue, gs);
               }
            }

            else
            {
               /* GRAY, GRAY ALPHA, RGB, or RGBA with gray background */
               png_ptr->background_1.red = png_ptr->background_1.green
                   = png_ptr->background_1.blue = png_ptr->background_1.gray;

               png_ptr->background.red = png_ptr->background.green
                   = png_ptr->background.blue = png_ptr->background.gray;
            }

            /* The background is now in screen gamma: */
            png_ptr->background_gamma_type = PNG_BACKGROUND_GAMMA_SCREEN;
         } /* color_type != PNG_COLOR_TYPE_PALETTE */
      }/* png_ptr->transformations & PNG_BACKGROUND */

      else
      /* Transformation does not include PNG_BACKGROUND */
#endif /* READ_BACKGROUND */
      if (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE
#ifdef PNG_READ_RGB_TO_GRAY_SUPPORTED
         /* RGB_TO_GRAY needs to have non-gamma-corrected values! */
         && ((png_ptr->transformations & PNG_EXPAND) == 0 ||
         (png_ptr->transformations & PNG_RGB_TO_GRAY) == 0)
#endif
         )
      {
         png_colorp palette = png_ptr->palette;
         int num_palette = png_ptr->num_palette;
         int i;

         /* NOTE: there are other transformations that should probably be in
          * here too.
          */
         for (i = 0; i < num_palette; i++)
         {
            palette[i].red = png_ptr->gamma_table[palette[i].red];
            palette[i].green = png_ptr->gamma_table[palette[i].green];
            palette[i].blue = png_ptr->gamma_table[palette[i].blue];
         }

         /* Done the gamma correction. */
         png_ptr->transformations &= ~PNG_GAMMA;
      } /* color_type == PALETTE && !PNG_BACKGROUND transformation */
   }
#ifdef PNG_READ_BACKGROUND_SUPPORTED
   else
#endif
#endif /* READ_GAMMA */

#ifdef PNG_READ_BACKGROUND_SUPPORTED
   /* No GAMMA transformation (see the hanging else 4 lines above) */
   if ((png_ptr->transformations & PNG_COMPOSE) != 0 &&
       (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE))
   {
      int i;
      int istop = (int)png_ptr->num_trans;
      png_color back;
      png_colorp palette = png_ptr->palette;

      back.red   = (png_byte)png_ptr->background.red;
      back.green = (png_byte)png_ptr->background.green;
      back.blue  = (png_byte)png_ptr->background.blue;

      for (i = 0; i < istop; i++)
      {
         if (png_ptr->trans_alpha[i] == 0)
         {
            palette[i] = back;
         }

         else if (png_ptr->trans_alpha[i] != 0xff)
         {
            /* The png_composite() macro is defined in png.h */
            png_composite(palette[i].red, palette[i].red,
                png_ptr->trans_alpha[i], back.red);

            png_composite(palette[i].green, palette[i].green,
                png_ptr->trans_alpha[i], back.green);

            png_composite(palette[i].blue, palette[i].blue,
                png_ptr->trans_alpha[i], back.blue);
         }
      }

      png_ptr->transformations &= ~PNG_COMPOSE;
   }
#endif /* READ_BACKGROUND */

#ifdef PNG_READ_SHIFT_SUPPORTED
   if ((png_ptr->transformations & PNG_SHIFT) != 0 &&
       (png_ptr->transformations & PNG_EXPAND) == 0 &&
       (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE))
   {
      int i;
      int istop = png_ptr->num_palette;
      int shift = 8 - png_ptr->sig_bit.red;

      png_ptr->transformations &= ~PNG_SHIFT;

      /* significant bits can be in the range 1 to 7 for a meaninful result, if
       * the number of significant bits is 0 then no shift is done (this is an
       * error condition which is silently ignored.)
       */
      if (shift > 0 && shift < 8)
         for (i=0; i<istop; ++i)
         {
            int component = png_ptr->palette[i].red;

            component >>= shift;
            png_ptr->palette[i].red = (png_byte)component;
         }

      shift = 8 - png_ptr->sig_bit.green;
      if (shift > 0 && shift < 8)
         for (i=0; i<istop; ++i)
         {
            int component = png_ptr->palette[i].green;

            component >>= shift;
            png_ptr->palette[i].green = (png_byte)component;
         }

      shift = 8 - png_ptr->sig_bit.blue;
      if (shift > 0 && shift < 8)
         for (i=0; i<istop; ++i)
         {
            int component = png_ptr->palette[i].blue;

            component >>= shift;
            png_ptr->palette[i].blue = (png_byte)component;
         }
   }
#endif /* READ_SHIFT */
}